

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e2etest.cc
# Opt level: O1

void load_replay_kvs(storage_t *st,fdb_kvs_handle *replay_kvs,fdb_seqnum_t seqnum)

{
  size_t *psVar1;
  size_t keylen;
  size_t keylen_00;
  fdb_status fVar2;
  size_t seek_keylen;
  int iVar3;
  ulong unaff_RBP;
  fdb_kvs_handle *pfVar4;
  fdb_kvs_handle *handle;
  uint uVar5;
  void *unaff_R12;
  char *unaff_R13;
  fdb_config *fconfig;
  bool bVar6;
  fdb_doc *rdoc;
  fdb_iterator *it;
  timeval __test_begin;
  fdb_file_handle *pfStackY_10a8;
  fdb_doc **ppfStackY_10a0;
  fdb_kvs_handle *pfStack_1090;
  fdb_doc *pfStack_1088;
  fdb_kvs_handle *pfStack_1080;
  fdb_kvs_handle *pfStack_1078;
  fdb_file_handle *pfStack_1070;
  fdb_kvs_config fStack_1068;
  timeval tStack_1050;
  person_t pStack_103c;
  fdb_kvs_handle *pfStack_230;
  void *pvStack_228;
  char *pcStack_220;
  fdb_config *pfStack_218;
  storage_t *psStack_210;
  code *pcStack_208;
  undefined1 auStack_1f8 [24];
  fdb_kvs_handle *pfStack_1e0;
  fdb_kvs_handle *pfStack_1d8;
  char acStack_1ca [10];
  size_t sStack_1c0;
  fdb_kvs_config fStack_1b8;
  timeval tStack_1a0;
  fdb_kvs_info fStack_190;
  fdb_config fStack_160;
  fdb_kvs_handle *pfStack_68;
  fdb_doc *local_38;
  fdb_kvs_handle *local_30;
  timeval local_28;
  
  gettimeofday(&local_28,(__timezone_ptr_t)0x0);
  local_38 = (fdb_doc *)0x0;
  pfVar4 = st->rtx;
  fVar2 = fdb_iterator_sequence_init(pfVar4,(fdb_iterator **)&local_30,0,seqnum,0);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    while (pfVar4 = local_30, fVar2 = fdb_iterator_get((fdb_iterator *)local_30,&local_38),
          fVar2 == FDB_RESULT_SUCCESS) {
      st = (storage_t *)local_38->body;
      if ((*(short *)&st[0xd].main == 1) &&
         (keylen._0_1_ = st[0xc].keyspace[0], keylen._1_1_ = st[0xc].keyspace[1],
         keylen._2_1_ = st[0xc].keyspace[2], keylen._3_1_ = st[0xc].keyspace[3],
         keylen._4_1_ = st[0xc].keyspace[4], keylen._5_1_ = st[0xc].keyspace[5],
         keylen._6_1_ = st[0xc].walflush, keylen._7_1_ = st[0xc].verify_set, pfVar4 = replay_kvs,
         fVar2 = fdb_set_kv(replay_kvs,(void *)((long)&st->main + 4),keylen,(void *)0x0,0),
         fVar2 != FDB_RESULT_SUCCESS)) goto LAB_00107197;
      if (*(short *)&st[0xd].main == 2) {
        keylen_00._0_1_ = st[0xc].keyspace[0];
        keylen_00._1_1_ = st[0xc].keyspace[1];
        keylen_00._2_1_ = st[0xc].keyspace[2];
        keylen_00._3_1_ = st[0xc].keyspace[3];
        keylen_00._4_1_ = st[0xc].keyspace[4];
        keylen_00._5_1_ = st[0xc].keyspace[5];
        keylen_00._6_1_ = st[0xc].walflush;
        keylen_00._7_1_ = st[0xc].verify_set;
        st = (storage_t *)((long)&st->main + 4);
        pfVar4 = replay_kvs;
        fVar2 = fdb_del_kv(replay_kvs,st,keylen_00);
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00107192;
      }
      fdb_doc_free(local_38);
      local_38 = (fdb_doc *)0x0;
      fVar2 = fdb_iterator_next((fdb_iterator *)local_30);
      if (fVar2 == FDB_RESULT_ITERATOR_FAIL) {
        fdb_iterator_close((fdb_iterator *)local_30);
        return;
      }
    }
    load_replay_kvs();
LAB_00107192:
    load_replay_kvs();
LAB_00107197:
    load_replay_kvs();
  }
  load_replay_kvs();
  pcStack_208 = (code *)0x1071c1;
  pfStack_68 = replay_kvs;
  gettimeofday(&tStack_1a0,(__timezone_ptr_t)0x0);
  fconfig = &fStack_160;
  pcStack_208 = (code *)0x1071d1;
  fdb_get_default_config();
  pcStack_208 = (code *)0x1071db;
  fdb_get_default_kvs_config();
  fStack_160.wal_threshold = 0x400;
  fStack_160.flags = 1;
  fStack_160.seqtree_opt = '\x01';
  fStack_160.compaction_threshold = '\n';
  auStack_1f8._0_8_ = (fdb_doc *)0x0;
  handle = (fdb_kvs_handle *)(auStack_1f8 + 0x10);
  pcStack_208 = (code *)0x107212;
  fVar2 = fdb_open((fdb_file_handle **)handle,"e2edb_records",fconfig);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pcStack_208 = (code *)0x107226;
    e2e_fdb_commit(*(fdb_file_handle **)&pfVar4->kvs_config,*(bool *)((long)&pfVar4->file + 6));
    handle = (fdb_kvs_handle *)(pfVar4->kvs_config).custom_cmp;
    pcStack_208 = (code *)0x107234;
    fVar2 = fdb_get_kvs_info(handle,&fStack_190);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      handle = (fdb_kvs_handle *)pfVar4->fhandle;
      pcStack_208 = (code *)0x107251;
      fVar2 = fdb_iterator_sequence_init(handle,(fdb_iterator **)(auStack_1f8 + 8),0,0,0);
      if (fVar2 == FDB_RESULT_SUCCESS) {
        fconfig = (fdb_config *)&(pfVar4->kvs_config).custom_cmp;
        do {
          pcStack_208 = (code *)0x107267;
          fVar2 = fdb_iterator_next((fdb_iterator *)auStack_1f8._8_8_);
        } while (fVar2 != FDB_RESULT_ITERATOR_FAIL);
        pcStack_208 = (code *)0x107276;
        fVar2 = fdb_iterator_prev((fdb_iterator *)auStack_1f8._8_8_);
        if (fVar2 != FDB_RESULT_ITERATOR_FAIL) {
          st = (storage_t *)auStack_1f8;
          unaff_R13 = acStack_1ca;
          unaff_RBP = 0;
          do {
            pcStack_208 = (code *)0x107298;
            handle = (fdb_kvs_handle *)auStack_1f8._8_8_;
            fVar2 = fdb_iterator_get((fdb_iterator *)auStack_1f8._8_8_,(fdb_doc **)st);
            if (fVar2 != FDB_RESULT_SUCCESS) {
              pcStack_208 = (code *)0x107445;
              replay();
LAB_00107445:
              pcStack_208 = (code *)0x10744a;
              replay();
LAB_0010744a:
              pcStack_208 = (code *)0x10744f;
              replay();
LAB_0010744f:
              pcStack_208 = (code *)0x107454;
              replay();
LAB_00107454:
              pcStack_208 = (code *)0x107459;
              replay();
LAB_00107459:
              pcStack_208 = (code *)0x10745e;
              replay();
LAB_0010745e:
              pcStack_208 = (code *)0x107463;
              replay();
              goto LAB_00107463;
            }
            unaff_R12 = *(void **)(auStack_1f8._0_8_ + 0x40);
            if (*(short *)((long)unaff_R12 + 0x410) == 6) {
              pcStack_208 = (code *)0x1072cc;
              sprintf(unaff_R13,"rkvs%d",unaff_RBP);
              pcStack_208 = (code *)0x1072e3;
              handle = (fdb_kvs_handle *)auStack_1f8._16_8_;
              fVar2 = fdb_kvs_open((fdb_file_handle *)auStack_1f8._16_8_,&pfStack_1d8,unaff_R13,
                                   &fStack_1b8);
              if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00107445;
              pcStack_208 = (code *)0x107301;
              load_replay_kvs((storage_t *)pfVar4,pfStack_1d8,
                              *(fdb_seqnum_t *)(auStack_1f8._0_8_ + 0x28));
              handle = (fdb_kvs_handle *)pfVar4->trie;
              psVar1 = (size_t *)((long)unaff_R12 + 0x408);
              unaff_R12 = (void *)((long)unaff_R12 + 4);
              pcStack_208 = (code *)0x107323;
              fVar2 = fdb_get_kv(handle,unaff_R12,*psVar1,&pfStack_1e0,&sStack_1c0);
              if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010744a;
              pcStack_208 = (code *)0x10733f;
              handle = (fdb_kvs_handle *)fconfig;
              fVar2 = fdb_rollback((fdb_kvs_handle **)fconfig,
                                   *(fdb_seqnum_t *)&pfStack_1e0[2].kvs_config);
              if (fVar2 == FDB_RESULT_SUCCESS) {
                pcStack_208 = (code *)0x107351;
                free(pfStack_1e0);
                pfStack_1e0 = (fdb_kvs_handle *)0x0;
                pcStack_208 = (code *)0x107367;
                e2e_fdb_commit(*(fdb_file_handle **)&pfVar4->kvs_config,true);
                handle = (fdb_kvs_handle *)pfVar4->fhandle;
                pcStack_208 = (code *)0x107375;
                fVar2 = fdb_get_kvs_info(handle,&fStack_190);
                if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00107454;
                pcStack_208 = (code *)0x10738b;
                e2e_fdb_commit((fdb_file_handle *)auStack_1f8._16_8_,
                               *(bool *)((long)&pfVar4->file + 6));
                pcStack_208 = (code *)0x107399;
                db_compare((fdb_kvs_handle *)(pfVar4->kvs_config).custom_cmp,pfStack_1d8);
                pcStack_208 = (code *)0x1073a3;
                handle = pfStack_1d8;
                fVar2 = fdb_kvs_close(pfStack_1d8);
                if (fVar2 == FDB_RESULT_SUCCESS) {
                  pcStack_208 = (code *)0x1073b8;
                  handle = (fdb_kvs_handle *)auStack_1f8._16_8_;
                  fVar2 = fdb_kvs_remove((fdb_file_handle *)auStack_1f8._16_8_,unaff_R13);
                  if (fVar2 == FDB_RESULT_SUCCESS) {
                    unaff_RBP = (ulong)((int)unaff_RBP + 1);
                    goto LAB_001073c2;
                  }
                  goto LAB_0010744f;
                }
                goto LAB_00107459;
              }
              if (fVar2 != FDB_RESULT_NO_DB_INSTANCE) goto LAB_0010745e;
              pcStack_208 = (code *)0x1073f9;
              free(pfStack_1e0);
              pcStack_208 = (code *)0x107403;
              fVar2 = fdb_kvs_close(pfStack_1d8);
              handle = pfStack_1d8;
              if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00107472;
              pcStack_208 = (code *)0x107416;
              handle = (fdb_kvs_handle *)auStack_1f8._16_8_;
              fVar2 = fdb_kvs_remove((fdb_file_handle *)auStack_1f8._16_8_,acStack_1ca);
              if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00107477;
              break;
            }
LAB_001073c2:
            pcStack_208 = (code *)0x1073cc;
            fdb_doc_free((fdb_doc *)auStack_1f8._0_8_);
            auStack_1f8._0_8_ = (fdb_doc *)0x0;
            pcStack_208 = (code *)0x1073df;
            fVar2 = fdb_iterator_prev((fdb_iterator *)auStack_1f8._8_8_);
          } while (fVar2 != FDB_RESULT_ITERATOR_FAIL);
        }
        pcStack_208 = (code *)0x107424;
        fdb_iterator_close((fdb_iterator *)auStack_1f8._8_8_);
        pcStack_208 = (code *)0x10742e;
        fdb_close((fdb_file_handle *)auStack_1f8._16_8_);
        return;
      }
      goto LAB_0010746d;
    }
  }
  else {
LAB_00107463:
    pcStack_208 = (code *)0x107468;
    replay();
  }
  pcStack_208 = (code *)0x10746d;
  replay();
LAB_0010746d:
  pcStack_208 = (code *)0x107472;
  replay();
LAB_00107472:
  pcStack_208 = (code *)0x107477;
  replay();
LAB_00107477:
  pcStack_208 = iterate_thread;
  replay();
  uVar5 = 0;
  ppfStackY_10a0 = (fdb_doc **)0x10749f;
  pfStack_230 = pfVar4;
  pvStack_228 = unaff_R12;
  pcStack_220 = unaff_R13;
  pfStack_218 = fconfig;
  psStack_210 = st;
  pcStack_208 = (code *)unaff_RBP;
  gettimeofday(&tStack_1050,(__timezone_ptr_t)0x0);
  pfStack_1088 = (fdb_doc *)0x0;
  ppfStackY_10a0 = (fdb_doc **)0x1074bf;
  fdb_open(&pfStack_1070,"e2edb_main",(fdb_config *)handle);
  ppfStackY_10a0 = (fdb_doc **)0x1074c9;
  fdb_get_default_kvs_config();
LAB_001074d3:
  ppfStackY_10a0 = (fdb_doc **)0x1074ee;
  fdb_kvs_open(pfStack_1070,&pfStack_1078,"e2ekv_alldocs",&fStack_1068);
  pfVar4 = pfStack_1078;
  if ((uVar5 & 1) == 0) {
    ppfStackY_10a0 = (fdb_doc **)0x10750a;
    fVar2 = fdb_snapshot_open(pfStack_1078,&pfStack_1080,0xffffffffffffffff);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      ppfStackY_10a0 = (fdb_doc **)0x107530;
      pfVar4 = pfStack_1080;
      fVar2 = fdb_iterator_init(pfStack_1080,(fdb_iterator **)&pfStack_1090,(void *)0x0,0,
                                (void *)0x0,0,0);
      if (fVar2 == FDB_RESULT_SUCCESS) goto LAB_0010755a;
    }
    else {
LAB_00107674:
      ppfStackY_10a0 = (fdb_doc **)0x107679;
      iterate_thread();
    }
    ppfStackY_10a0 = (fdb_doc **)0x10767e;
    iterate_thread();
  }
  else {
    ppfStackY_10a0 = (fdb_doc **)0x107552;
    fVar2 = fdb_iterator_init(pfStack_1078,(fdb_iterator **)&pfStack_1090,(void *)0x0,0,(void *)0x0,
                              0,0);
    if (fVar2 == FDB_RESULT_SUCCESS) {
LAB_0010755a:
      iVar3 = 0;
      do {
        ppfStackY_10a0 = (fdb_doc **)0x10756a;
        pfVar4 = pfStack_1090;
        fVar2 = fdb_iterator_get((fdb_iterator *)pfStack_1090,&pfStack_1088);
        bVar6 = iVar3 != 0;
        iVar3 = iVar3 + -1;
        if ((bVar6) && (fVar2 != FDB_RESULT_SUCCESS)) goto LAB_0010766f;
        ppfStackY_10a0 = (fdb_doc **)0x107582;
        fdb_doc_free(pfStack_1088);
        pfStack_1088 = (fdb_doc *)0x0;
        ppfStackY_10a0 = (fdb_doc **)0x107595;
        fVar2 = fdb_iterator_next((fdb_iterator *)pfStack_1090);
      } while (fVar2 != FDB_RESULT_ITERATOR_FAIL);
      iVar3 = 0;
LAB_0010759d:
      while( true ) {
        ppfStackY_10a0 = (fdb_doc **)0x1075a7;
        fVar2 = fdb_iterator_prev((fdb_iterator *)pfStack_1090);
        if (fVar2 == FDB_RESULT_ITERATOR_FAIL) goto LAB_001075d6;
        ppfStackY_10a0 = (fdb_doc **)0x1075b9;
        pfVar4 = pfStack_1090;
        fVar2 = fdb_iterator_get((fdb_iterator *)pfStack_1090,&pfStack_1088);
        if (fVar2 != FDB_RESULT_SUCCESS) break;
        ppfStackY_10a0 = (fdb_doc **)0x1075cb;
        fdb_doc_free(pfStack_1088);
        pfStack_1088 = (fdb_doc *)0x0;
      }
      ppfStackY_10a0 = (fdb_doc **)0x10766f;
      iterate_thread();
LAB_0010766f:
      ppfStackY_10a0 = (fdb_doc **)0x107674;
      iterate_thread();
      goto LAB_00107674;
    }
  }
  ppfStackY_10a0 = (fdb_doc **)compact_thread;
  iterate_thread();
  ppfStackY_10a0 = &pfStack_1088;
  fdb_open(&pfStackY_10a8,"e2edb_main",(fdb_config *)pfVar4);
  iVar3 = 3;
  do {
    sleep(2);
    fdb_compact(pfStackY_10a8,(char *)0x0);
    iVar3 = iVar3 + -1;
  } while (iVar3 != 0);
  fdb_close(pfStackY_10a8);
  return;
LAB_001075d6:
  ppfStackY_10a0 = (fdb_doc **)0x1075de;
  gen_person(&pStack_103c);
  pfVar4 = pfStack_1090;
  ppfStackY_10a0 = (fdb_doc **)0x1075eb;
  seek_keylen = strlen(pStack_103c.key);
  ppfStackY_10a0 = (fdb_doc **)0x1075ff;
  fdb_iterator_seek((fdb_iterator *)pfVar4,&pStack_103c,seek_keylen,(byte)iVar3 & 1);
  iVar3 = iVar3 + 1;
  if (iVar3 == 10) goto code_r0x00107608;
  goto LAB_0010759d;
code_r0x00107608:
  ppfStackY_10a0 = (fdb_doc **)0x107612;
  fdb_iterator_close((fdb_iterator *)pfStack_1090);
  if ((uVar5 & 1) == 0) {
    ppfStackY_10a0 = (fdb_doc **)0x107622;
    fdb_kvs_close(pfStack_1080);
  }
  ppfStackY_10a0 = (fdb_doc **)0x10762c;
  fdb_kvs_close(pfStack_1078);
  uVar5 = uVar5 + 1;
  if (uVar5 == 0x32) {
    ppfStackY_10a0 = (fdb_doc **)0x107643;
    fdb_doc_free(pfStack_1088);
    pfStack_1088 = (fdb_doc *)0x0;
    ppfStackY_10a0 = (fdb_doc **)0x107656;
    fdb_close(pfStack_1070);
    return;
  }
  goto LAB_001074d3;
}

Assistant:

void load_replay_kvs(storage_t *st, fdb_kvs_handle *replay_kvs, fdb_seqnum_t seqnum) {

    TEST_INIT();

    fdb_iterator *it;
    fdb_doc *rdoc = NULL;
    fdb_status status;
    transaction_t *tx;


    // iterator end at seqnum
    status = fdb_iterator_sequence_init(st->rtx, &it, 0, seqnum,
                                        FDB_ITR_NONE);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    do {
        status = fdb_iterator_get(it, &rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);

        tx = (transaction_t *)rdoc->body;
        if (tx->type == SET_PERSON) {
            status = fdb_set_kv(replay_kvs,
                                tx->refkey,
                                tx->refkey_len,
                                NULL,0);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
        }
        if (tx->type == DEL_PERSON) {
            status = fdb_del_kv(replay_kvs,
                                tx->refkey,
                                tx->refkey_len);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
        }
        fdb_doc_free(rdoc);
        rdoc=NULL;

    } while (fdb_iterator_next(it) != FDB_RESULT_ITERATOR_FAIL);
    fdb_iterator_close(it);

}